

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::~PosixWritableFile(PosixWritableFile *this)

{
  pointer pcVar1;
  WritableFile local_10;
  
  if (-1 < this->fd_) {
    Close((PosixWritableFile *)&stack0xfffffffffffffff0);
    if (local_10._vptr_WritableFile != (_func_int **)0x0) {
      operator_delete__(local_10._vptr_WritableFile);
    }
  }
  pcVar1 = (this->dirname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dirname_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~PosixWritableFile() override {
    if (fd_ >= 0) {
      // Ignoring any potential errors
      Close();
    }
  }